

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::append_entries_in_bg(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  pthread_t __target_thread;
  pointer __stat_loc;
  string local_50;
  string thread_name;
  
  std::__cxx11::string::string((string *)&thread_name,"nuraft_append",(allocator *)&local_50);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,thread_name._M_dataplus._M_p);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __stat_loc = thread_name._M_dataplus._M_p;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    __stat_loc = thread_name._M_dataplus._M_p;
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_50,"bg append_entries thread initiated");
      __stat_loc = (pointer)0x4;
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"append_entries_in_bg",0x68,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  do {
    EventAwaiter::wait(this->bg_append_ea_,__stat_loc);
    LOCK();
    (this->bg_append_ea_->status)._M_i = idle;
    UNLOCK();
    if (((this->stopping_)._M_base._M_i & 1U) != 0) break;
    append_entries_in_bg_exec(this);
  } while (((this->stopping_)._M_base._M_i & 1U) == 0);
  LOCK();
  (this->append_bg_stopped_)._M_base._M_i = true;
  UNLOCK();
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_50,"bg append_entries thread terminated");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"append_entries_in_bg",0x71,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::__cxx11::string::~string((string *)&thread_name);
  return;
}

Assistant:

void raft_server::append_entries_in_bg() {
    std::string thread_name = "nuraft_append";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    p_in("bg append_entries thread initiated");
    do {
        bg_append_ea_->wait();
        bg_append_ea_->reset();
        if (stopping_) break;

        append_entries_in_bg_exec();
    } while (!stopping_);
    append_bg_stopped_ = true;
    p_in("bg append_entries thread terminated");
}